

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<int>::push_back(PropertyT<int> *this)

{
  value_type_conflict2 local_14;
  PropertyT<int> *local_10;
  PropertyT<int> *this_local;
  
  local_14 = 0;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back(&this->data_,&local_14);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }